

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_list.cpp
# Opt level: O1

OpenFileInfo * __thiscall
duckdb::SimpleMultiFileList::GetFile
          (OpenFileInfo *__return_storage_ptr__,SimpleMultiFileList *this,idx_t i)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pOVar2;
  pointer pOVar3;
  pointer pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  const_reference pvVar6;
  ulong uVar7;
  char *local_38;
  size_type local_30;
  char local_28;
  undefined7 uStack_27;
  undefined8 uStack_20;
  
  pOVar2 = (this->super_MultiFileList).paths.
           super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
           super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pOVar3 = (this->super_MultiFileList).paths.
           super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
           super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((pOVar2 == pOVar3) ||
     (uVar7 = ((long)pOVar3 - (long)pOVar2 >> 4) * -0x5555555555555555, uVar7 < i || uVar7 - i == 0)
     ) {
    local_38 = &local_28;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,anon_var_dwarf_63b5960 + 9);
    paVar1 = &(__return_storage_ptr__->path).field_2;
    (__return_storage_ptr__->path)._M_dataplus._M_p = (pointer)paVar1;
    if (local_38 == &local_28) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_27,local_28);
      *(undefined8 *)((long)&(__return_storage_ptr__->path).field_2 + 8) = uStack_20;
    }
    else {
      (__return_storage_ptr__->path)._M_dataplus._M_p = local_38;
      (__return_storage_ptr__->path).field_2._M_allocated_capacity = CONCAT71(uStack_27,local_28);
    }
    (__return_storage_ptr__->path)._M_string_length = local_30;
    (__return_storage_ptr__->extended_info).internal.
    super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__return_storage_ptr__->extended_info).internal.
    super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    pvVar6 = vector<duckdb::OpenFileInfo,_true>::operator[](&(this->super_MultiFileList).paths,i);
    (__return_storage_ptr__->path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->path).field_2;
    pcVar4 = (pvVar6->path)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar4,pcVar4 + (pvVar6->path)._M_string_length);
    (__return_storage_ptr__->extended_info).internal.
    super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pvVar6->extended_info).internal.
         super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var5 = (pvVar6->extended_info).internal.
             super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (__return_storage_ptr__->extended_info).internal.
    super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var5;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

OpenFileInfo SimpleMultiFileList::GetFile(idx_t i) {
	if (paths.empty() || i >= paths.size()) {
		return OpenFileInfo("");
	}

	return paths[i];
}